

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::GetVertexArrayIndexedTest::Check64
          (GetVertexArrayIndexedTest *this,GLenum pname,GLuint index,GLint64 expected)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *pTVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  Enum<int,_2UL> EVar6;
  Enum<int,_2UL> local_3a0;
  MessageBuilder local_390;
  GetNameFunc local_210;
  int local_208;
  Enum<int,_2UL> local_200;
  GetNameFunc local_1f0;
  int local_1e8;
  Enum<int,_2UL> local_1e0 [2];
  MessageBuilder local_1c0;
  int local_3c;
  Functions *pFStack_38;
  GLenum error;
  GLint64 result;
  Functions *gl;
  GLint64 expected_local;
  GLuint index_local;
  GLenum pname_local;
  GetVertexArrayIndexedTest *this_local;
  
  gl = (Functions *)expected;
  expected_local._0_4_ = index;
  expected_local._4_4_ = pname;
  _index_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  result = CONCAT44(extraout_var,iVar1);
  pFStack_38 = (Functions *)0x0;
  (**(code **)(result + 0xb78))
            (this->m_vao,(GLuint)expected_local,expected_local._4_4_,&stack0xffffffffffffffc8);
  local_3c = (**(code **)(result + 0x800))();
  if (local_3c == 0) {
    if (pFStack_38 == gl) {
      this_local._7_1_ = true;
    }
    else {
      pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_390,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_390,(char (*) [45])"GetVertexArrayIndexed64iv called with index ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)&expected_local);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [16])" and with pname");
      EVar6 = glu::getVertexAttribParameterNameStr(expected_local._4_4_);
      local_3a0.m_getName = EVar6.m_getName;
      local_3a0.m_value = EVar6.m_value;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_3a0);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])0x2c67c35);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(long *)&stack0xffffffffffffffc8);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [7])0x2a796ef);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(long *)&gl);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [27])0x2a84efa);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_390);
      this_local._7_1_ = false;
    }
  }
  else {
    pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    tcu::TestLog::operator<<(&local_1c0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_1c0,(char (*) [45])"GetVertexArrayIndexed64iv called with index ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)&expected_local);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [13])", with pname");
    EVar6 = glu::getVertexAttribParameterNameStr(expected_local._4_4_);
    local_1f0 = EVar6.m_getName;
    local_1e8 = EVar6.m_value;
    local_1e0[0].m_getName = local_1f0;
    local_1e0[0].m_value = local_1e8;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1e0);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [25])0x2a79573);
    EVar6 = glu::getErrorStr(local_3c);
    local_210 = EVar6.m_getName;
    local_208 = EVar6.m_value;
    local_200.m_getName = local_210;
    local_200.m_value = local_208;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_200);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [19])0x2a7930e);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool GetVertexArrayIndexedTest::Check64(const glw::GLenum pname, const glw::GLuint index, const glw::GLint64 expected)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint64 result = 0;

	gl.getVertexArrayIndexed64iv(m_vao, index, pname, &result);

	if (glw::GLenum error = gl.getError())
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "GetVertexArrayIndexed64iv called with index "
											<< index << ", with pname" << glu::getVertexAttribParameterNameStr(pname)
											<< " unexpectedly generated " << glu::getErrorStr(error)
											<< "error. Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	if (result != expected)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "GetVertexArrayIndexed64iv called with index "
											<< index << " and with pname" << glu::getVertexAttribParameterNameStr(pname)
											<< " returned " << result << ", but " << expected
											<< " was expected. Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}